

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

TablePrinter * Catch::operator<<(TablePrinter *tp,Duration *value)

{
  undefined8 in_RAX;
  ostream *poVar1;
  char *pcVar2;
  double dVar3;
  undefined8 uStack_18;
  
  dVar3 = value->m_inNanoseconds;
  switch(value->m_units) {
  case Microseconds:
    dVar3 = dVar3 / 1000.0;
    break;
  case Milliseconds:
    dVar3 = dVar3 / 1000000.0;
    break;
  case Seconds:
    dVar3 = dVar3 / 1000000000.0;
    break;
  case Minutes:
    dVar3 = dVar3 / 60000000000.0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  uStack_18 = CONCAT17(0x20,(undefined7)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 7),1);
  switch(value->m_units) {
  case Nanoseconds:
    pcVar2 = "ns";
    break;
  case Microseconds:
    pcVar2 = "us";
    break;
  case Milliseconds:
    pcVar2 = "ms";
    break;
  case Seconds:
    pcVar2 = "s";
    break;
  case Minutes:
    pcVar2 = "m";
    break;
  default:
    pcVar2 = "** internal error **";
  }
  std::ostream::write((char *)poVar1,(long)pcVar2);
  return tp;
}

Assistant:

TablePrinter &operator << (TablePrinter &tp, T const &value) {
            tp.m_oss << value;
            return tp;
        }